

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

void JSONNode::deleteJSONNode(JSONNode *ptr)

{
  if (ptr != (JSONNode *)0x0) {
    ~JSONNode(ptr);
  }
  operator_delete(ptr);
  return;
}

Assistant:

void JSONNode::deleteJSONNode(JSONNode * ptr) json_nothrow {
	#ifdef JSON_MEMORY_POOL
		ptr -> ~JSONNode();
		json_node_mempool.deallocate((void*)ptr);
	#elif defined(JSON_MEMORY_CALLBACKS)
		ptr -> ~JSONNode();
		libjson_free<JSONNode>(ptr);
	#else
		delete ptr;
	#endif
}